

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

bool __thiscall slang::ast::PortSymbol::isNetPort(PortSymbol *this)

{
  Expression *pEVar1;
  PortSymbol *in_RDI;
  Expression *ie;
  bool local_21;
  bool local_1;
  
  pEVar1 = getInternalExpr(in_RDI);
  if (pEVar1 == (Expression *)0x0) {
    local_21 = false;
    if (in_RDI->internalSymbol != (Symbol *)0x0) {
      local_21 = in_RDI->internalSymbol->kind == Net;
    }
    local_1 = local_21;
  }
  else {
    local_1 = isNetPortImpl((Expression *)this);
  }
  return local_1;
}

Assistant:

bool PortSymbol::isNetPort() const {
    if (auto ie = getInternalExpr())
        return isNetPortImpl(*ie);

    return internalSymbol && internalSymbol->kind == SymbolKind::Net;
}